

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

void __thiscall ON_BinaryArchive::ON_BinaryArchive(ON_BinaryArchive *this,archive_mode mode)

{
  endian eVar1;
  
  this->_vptr_ON_BinaryArchive = (_func_int **)&PTR__ON_BinaryArchive_0081cc48;
  this->m_3dm_version = 0;
  this->m_3dm_v1_layer_index = 0;
  this->m_3dm_v1_material_index = 0;
  this->m_3dm_opennurbs_version = 0;
  this->m_archive_runtime_environment = Unset;
  this->m_3dm_start_section_offset = 0;
  this->m_3dm_previous_table = Unset;
  this->m_3dm_active_table = Unset;
  this->m_3dm_first_failed_table = Unset;
  this->m_user_data_depth = 0;
  this->m_3dm_table_status_list = (ON_3dmTableStatusLink *)0x0;
  this->m_current_positionX = 0;
  this->m_crc_error_count = 0;
  this->m_critical_error_count = 0;
  this->m_storage_device_error = 0;
  this->m_error_message_mask = 0;
  this->m_3dm_end_mark_length = 0;
  (this->m_chunk)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081d110;
  this->m_compressor = (ON_CompressorImplementation *)0x0;
  (this->m_chunk).m_a = (ON_3DM_BIG_CHUNK *)0x0;
  (this->m_chunk).m_count = 0;
  (this->m_chunk).m_capacity = 0;
  this->m_bDoChunkCRC = false;
  this->m_bChunkBoundaryCheck = false;
  eVar1 = ON::Endian();
  this->m_endian = eVar1;
  this->m_mode = mode;
  (this->m_user_data_filter)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081d150;
  (this->m_user_data_filter).m_a = (ON_UserDataItemFilter *)0x0;
  (this->m_user_data_filter).m_count = 0;
  (this->m_user_data_filter).m_capacity = 0;
  this->m_save_3dm_render_mesh_flags = 0xffffffff;
  this->m_save_3dm_analysis_mesh_flags = 0xffffffff;
  this->m_bSave3dmPreviewImage = true;
  this->m_bUseBufferCompression = true;
  this->m_bReservedA = false;
  this->m_bReservedB = false;
  this->m_bReservedC = false;
  this->m_bReservedD = false;
  this->m_bReservedE = false;
  this->m_bReservedF = false;
  ON_ComponentManifest::ON_ComponentManifest(&this->m_manifest);
  ON_ManifestMap::ON_ManifestMap(&this->m_manifest_map);
  this->m_bReferencedComponentIndexMapping = true;
  this->m_bReferencedComponentIdMapping = true;
  ON_wString::ON_wString(&this->m_archive_file_name);
  ON_wString::ON_wString(&this->m_archive_directory_name);
  ON_wString::ON_wString(&this->m_archive_full_path);
  ON_wString::ON_wString(&this->m_archive_saved_as_full_path);
  this->m_b3dmArchiveMoved = false;
  this->m_SetModelComponentSerialNumbers = false;
  this->m_bCheckForRemappedIds = false;
  this->m_IntentionallyWriteCorrupt3dmStartSection = '\0';
  this->m_reservedB = false;
  this->m_reserved2 = 0;
  this->m_model_serial_number = 0;
  this->m_reference_model_serial_number = 0;
  this->m_instance_definition_model_serial_number = 0;
  this->m_reserved1 = 0;
  (this->m_V3_plugin_id_list)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081c438;
  (this->m_V3_plugin_id_list).m_a = (ON_UUID_struct *)0x0;
  (this->m_V3_plugin_id_list).m_count = 0;
  (this->m_V3_plugin_id_list).m_capacity = 0;
  this->m_V1_layer_list = (ON__3dmV1LayerIndex *)0x0;
  (this->m_annotation_context).m_binary_archive = (ON_BinaryArchive *)0x0;
  (this->m_annotation_context).m_annotation_settings = (ON_3dmAnnotationSettings *)0x0;
  (this->m_annotation_context).m_managed_annotation_settings = (ON_3dmAnnotationSettings *)0x0;
  *(undefined4 *)((long)&(this->m_annotation_context).m_managed_annotation_settings + 7) = 0;
  (this->m_annotation_context).m_parent_dim_style = (ON_DimStyle *)0x0;
  (this->m_annotation_context).m_managed_parent_dim_style = (ON_DimStyle *)0x0;
  (this->m_annotation_context).m_override_dim_style = (ON_DimStyle *)0x0;
  (this->m_annotation_context).m_managed_override_dim_style = (ON_DimStyle *)0x0;
  (this->m_annotation_context).m_V5_3dm_archive_dim_style_index = -0x7fffffff;
  (this->m_archive_text_style_table)._vptr_ON_SimpleArray =
       (_func_int **)&PTR__ON_SimpleArray_0081d190;
  (this->m_archive_text_style_table).m_a = (ON_TextStyle **)0x0;
  (this->m_archive_text_style_table).m_count = 0;
  (this->m_archive_text_style_table).m_capacity = 0;
  (this->m_text_style_to_dim_style_archive_index_map)._vptr_ON_SimpleArray =
       (_func_int **)&PTR__ON_SimpleArray_0081d1d0;
  (this->m_text_style_to_dim_style_archive_index_map).m_a = (ON_2dex *)0x0;
  (this->m_text_style_to_dim_style_archive_index_map).m_count = 0;
  (this->m_text_style_to_dim_style_archive_index_map).m_capacity = 0;
  (this->m_archive_dim_style_table)._vptr_ON_SimpleArray =
       (_func_int **)&PTR__ON_SimpleArray_0081d210;
  (this->m_archive_dim_style_table).m_a = (ON_DimStyle **)0x0;
  (this->m_archive_dim_style_table).m_count = 0;
  (this->m_archive_dim_style_table).m_capacity = 0;
  (this->m_DELETE_ME_archive_dim_style_overrides)._vptr_ON_SimpleArray =
       (_func_int **)&PTR__ON_SimpleArray_0081d210;
  this->m_archive_current_dim_style = (ON_DimStyle *)0x0;
  this->m_archive_dim_style_table_status = 0;
  this->m_bLegacyOverrideDimStylesInArchive = false;
  (this->m_DELETE_ME_archive_dim_style_overrides).m_a = (ON_DimStyle **)0x0;
  (this->m_DELETE_ME_archive_dim_style_overrides).m_count = 0;
  (this->m_DELETE_ME_archive_dim_style_overrides).m_capacity = 0;
  this->m_archive_dim_style_table_read_index = 0xffffffff;
  ON_String::ON_String(&this->m_archive_3dm_start_section_comment,&ON_String::EmptyString);
  this->m_archive_3dm_properties = (ON_3dmProperties *)0x0;
  this->m_archive_3dm_settings = (ON_3dmSettings *)0x0;
  if (mode - read3dm < 2) {
    this->m_bChunkBoundaryCheck = true;
  }
  (this->m_annotation_context).m_binary_archive = this;
  return;
}

Assistant:

ON_BinaryArchive::ON_BinaryArchive( ON::archive_mode mode )
  : m_mode(mode)
{
  if (ON::archive_mode::read3dm == mode || ON::archive_mode::write3dm == mode)
    m_bChunkBoundaryCheck = true;
  m_annotation_context.SetReferencedBinaryArchive(this);
}